

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O2

int mbedtls_x509_get_subject_alt_name_ext
              (uchar **p,uchar *end,mbedtls_x509_sequence *subject_alt_name)

{
  byte bVar1;
  int iVar2;
  mbedtls_x509_sequence *pmVar3;
  byte *pbVar4;
  undefined1 auStack_b8 [8];
  mbedtls_x509_subject_alternative_name tmp_san_name;
  size_t local_60;
  size_t tag_len;
  mbedtls_x509_sequence *local_50;
  undefined1 auStack_48 [8];
  mbedtls_x509_buf tmp_san_buf;
  
  pbVar4 = *p;
  tag_len = (size_t)end;
  local_50 = subject_alt_name;
  while( true ) {
    if (tag_len <= pbVar4) {
      subject_alt_name->next = (mbedtls_asn1_sequence *)0x0;
      iVar2 = -0x2566;
      if (*p == (uchar *)tag_len) {
        iVar2 = 0;
      }
      return iVar2;
    }
    auStack_b8 = (undefined1  [8])0x0;
    tmp_san_name.type = 0;
    tmp_san_name._4_4_ = 0;
    tmp_san_name.san._0_8_ = 0;
    tmp_san_name.san.other_name.type_id.len = 0;
    tmp_san_name.san.other_name.type_id.p = (uchar *)0x0;
    tmp_san_name.san._24_8_ = 0;
    tmp_san_name.san.directory_name.val.len = 0;
    tmp_san_name.san.directory_name.val.p = (uchar *)0x0;
    tmp_san_name.san.directory_name.next = (mbedtls_asn1_named_data *)0x0;
    tmp_san_name.san._56_8_ = 0;
    bVar1 = *pbVar4;
    *p = pbVar4 + 1;
    auStack_48._0_4_ = (uint)bVar1;
    iVar2 = mbedtls_asn1_get_len(p,(uchar *)tag_len,&local_60);
    if (iVar2 != 0) {
      return iVar2 + -0x2500;
    }
    tmp_san_buf.len = (size_t)*p;
    tmp_san_buf._0_8_ = local_60;
    if ((bVar1 & 0xffffffc0) != 0x80) {
      return -0x2562;
    }
    iVar2 = mbedtls_x509_parse_subject_alt_name
                      ((mbedtls_x509_buf *)auStack_48,
                       (mbedtls_x509_subject_alternative_name *)auStack_b8);
    pmVar3 = local_50;
    if ((iVar2 != -0x2080) && (iVar2 != 0)) break;
    mbedtls_x509_free_subject_alt_name((mbedtls_x509_subject_alternative_name *)auStack_b8);
    pmVar3 = subject_alt_name;
    if ((subject_alt_name->buf).p != (uchar *)0x0) {
      if (subject_alt_name->next != (mbedtls_asn1_sequence *)0x0) {
        return -0x2500;
      }
      pmVar3 = (mbedtls_x509_sequence *)calloc(1,0x20);
      subject_alt_name->next = pmVar3;
      if (pmVar3 == (mbedtls_x509_sequence *)0x0) {
        return -0x256a;
      }
    }
    (pmVar3->buf).p = (uchar *)tmp_san_buf.len;
    *(ulong *)&pmVar3->buf = CONCAT44(auStack_48._4_4_,auStack_48._0_4_);
    (pmVar3->buf).len = tmp_san_buf._0_8_;
    pbVar4 = *p + tmp_san_buf._0_8_;
    *p = pbVar4;
    subject_alt_name = pmVar3;
  }
  mbedtls_asn1_sequence_free(local_50->next);
  pmVar3->next = (mbedtls_asn1_sequence *)0x0;
  return iVar2;
}

Assistant:

int mbedtls_x509_get_subject_alt_name_ext(unsigned char **p,
                                          const unsigned char *end,
                                          mbedtls_x509_sequence *subject_alt_name)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t tag_len;
    mbedtls_asn1_sequence *cur = subject_alt_name;

    while (*p < end) {
        mbedtls_x509_subject_alternative_name tmp_san_name;
        mbedtls_x509_buf tmp_san_buf;
        memset(&tmp_san_name, 0, sizeof(tmp_san_name));

        tmp_san_buf.tag = **p;
        (*p)++;

        if ((ret = mbedtls_asn1_get_len(p, end, &tag_len)) != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
        }

        tmp_san_buf.p = *p;
        tmp_san_buf.len = tag_len;

        if ((tmp_san_buf.tag & MBEDTLS_ASN1_TAG_CLASS_MASK) !=
            MBEDTLS_ASN1_CONTEXT_SPECIFIC) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                     MBEDTLS_ERR_ASN1_UNEXPECTED_TAG);
        }

        /*
         * Check that the SAN is structured correctly by parsing it.
         * The SAN structure is discarded afterwards.
         */
        ret = mbedtls_x509_parse_subject_alt_name(&tmp_san_buf, &tmp_san_name);
        /*
         * In case the extension is malformed, return an error,
         * and clear the allocated sequences.
         */
        if (ret != 0 && ret != MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE) {
            mbedtls_asn1_sequence_free(subject_alt_name->next);
            subject_alt_name->next = NULL;
            return ret;
        }

        mbedtls_x509_free_subject_alt_name(&tmp_san_name);
        /* Allocate and assign next pointer */
        if (cur->buf.p != NULL) {
            if (cur->next != NULL) {
                return MBEDTLS_ERR_X509_INVALID_EXTENSIONS;
            }

            cur->next = mbedtls_calloc(1, sizeof(mbedtls_asn1_sequence));

            if (cur->next == NULL) {
                return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                         MBEDTLS_ERR_ASN1_ALLOC_FAILED);
            }

            cur = cur->next;
        }

        cur->buf = tmp_san_buf;
        *p += tmp_san_buf.len;
    }

    /* Set final sequence entry's next pointer to NULL */
    cur->next = NULL;

    if (*p != end) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    return 0;
}